

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O1

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageConditionalOperator::process
          (MessageConditionalOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  char cVar1;
  _func_int **pp_Var2;
  MessageConditionalOperator *in_RDX;
  
  if (message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
      _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
      super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl != (Message *)0x0) {
    cVar1 = (*(code *)message[4]._M_t.
                      super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                      .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl)(message + 1);
    if (cVar1 == '\0') {
      pp_Var2 = (_func_int **)0x0;
      in_RDX = this;
      goto LAB_0028e3c0;
    }
  }
  pp_Var2 = (in_RDX->super_FilterOperator)._vptr_FilterOperator;
LAB_0028e3c0:
  (this->super_FilterOperator)._vptr_FilterOperator = pp_Var2;
  (in_RDX->super_FilterOperator)._vptr_FilterOperator = (_func_int **)0x0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageConditionalOperator::process(std::unique_ptr<Message> message)
{
    if (evalFunction) {
        if (evalFunction(message.get())) {
            return message;
        }
        return nullptr;
    }
    return message;
}